

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createCylinderShapeY
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  undefined8 local_20;
  btScalar local_18;
  btScalar local_14;
  
  this_00 = (btCollisionShape *)btCylinderShape::operator_new(0x48);
  local_20 = (btCollisionShape *)CONCAT44(height,radius);
  local_14 = 0.0;
  local_18 = radius;
  btCylinderShape::btCylinderShape((btCylinderShape *)this_00,(btVector3 *)&local_20);
  local_20 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(btCollisionShape **)&local_20);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCylinderShapeY(btScalar radius,btScalar height)
{
	btCylinderShape* shape = new btCylinderShape(btVector3(radius,height,radius));
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}